

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O2

void RangeEnc_ShiftLow(CPpmd7z_RangeEnc *p)

{
  UInt64 *pUVar1;
  Byte BVar2;
  ulong uVar3;
  UInt64 UVar4;
  
  uVar3 = p->Low;
  if (uVar3 >> 0x18 == 0xff) {
    UVar4 = p->CacheSize + 1;
  }
  else {
    BVar2 = p->Cache;
    do {
      (*p->Stream->Write)(p->Stream,BVar2 + *(char *)((long)&p->Low + 4));
      pUVar1 = &p->CacheSize;
      *pUVar1 = *pUVar1 - 1;
      BVar2 = 0xff;
    } while (*pUVar1 != 0);
    uVar3 = p->Low;
    p->Cache = (Byte)(uVar3 >> 0x18);
    UVar4 = 1;
  }
  p->CacheSize = UVar4;
  p->Low = (ulong)(uint)((int)uVar3 << 8);
  return;
}

Assistant:

static void RangeEnc_ShiftLow(CPpmd7z_RangeEnc *p)
{
  if ((UInt32)p->Low < (UInt32)0xFF000000 || (unsigned)(p->Low >> 32) != 0)
  {
    Byte temp = p->Cache;
    do
    {
      p->Stream->Write(p->Stream, (Byte)(temp + (Byte)(p->Low >> 32)));
      temp = 0xFF;
    }
    while(--p->CacheSize != 0);
    p->Cache = (Byte)((UInt32)p->Low >> 24);
  }
  p->CacheSize++;
  p->Low = ((UInt32)p->Low << 8) & 0xFFFFFFFF;
}